

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor_t.h
# Opt level: O3

void __thiscall tensor_t<float>::tensor_t(tensor_t<float> *this,int _x,int _y,int _z)

{
  pointer pfVar1;
  allocator_type local_39;
  undefined1 local_38 [16];
  pointer local_28;
  
  (this->data).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->data).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->data).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->size).x = 0;
  (this->size).y = 0;
  (this->size).z = 0;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_38,(long)(_y * _x * _z),&local_39);
  pfVar1 = (this->data).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->data).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_38._0_8_;
  (this->data).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)local_38._8_8_;
  (this->data).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_28;
  local_38 = ZEXT816(0) << 0x20;
  local_28 = (pointer)0x0;
  if (pfVar1 != (pointer)0x0) {
    operator_delete(pfVar1);
    if ((pointer)local_38._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_38._0_8_);
    }
  }
  (this->size).x = _x;
  (this->size).y = _y;
  (this->size).z = _z;
  return;
}

Assistant:

tensor_t(int _x, int _y, int _z) {
    data = std::vector<T>(static_cast<unsigned long>(_x * _y * _z));
    size.x = _x;
    size.y = _y;
    size.z = _z;
  }